

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

void helicsBrokerDisconnect(HelicsBroker broker,HelicsError *err)

{
  Broker *pBVar1;
  Broker *brk;
  HelicsError *in_stack_ffffffffffffffe0;
  HelicsBroker in_stack_ffffffffffffffe8;
  
  pBVar1 = getBroker(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (pBVar1 != (Broker *)0x0) {
    (*pBVar1->_vptr_Broker[3])();
  }
  return;
}

Assistant:

void helicsBrokerDisconnect(HelicsBroker broker, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    try {
        brk->disconnect();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}